

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.h
# Opt level: O0

void __thiscall Abstract<4U>::~Abstract(Abstract<4U> *this)

{
  Abstract<4U> *in_RDI;
  
  ~Abstract(in_RDI);
  operator_delete(in_RDI,0x70);
  return;
}

Assistant:

void rename(int slot_num, int counter_num) {
		char* tp = new char[20];
		std::sprintf(tp, "WavingSketch<%d,%d>", slot_num, counter_num);
		name = tp;
	}